

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pattern_formatter-inl.h
# Opt level: O2

void __thiscall
spdlog::details::A_formatter<spdlog::details::null_scoped_padder>::format
          (A_formatter<spdlog::details::null_scoped_padder> *this,log_msg *param_1,tm *tm_time,
          memory_buf_t *dest)

{
  fmt_helper *this_00;
  char *pcVar1;
  undefined1 *dest_00;
  string_view_t view;
  
  dest_00 = full_days;
  this_00 = *(fmt_helper **)(full_days + (long)tm_time->tm_wday * 8);
  pcVar1 = (char *)strlen((char *)this_00);
  view.size_ = (size_t)dest;
  view.data_ = pcVar1;
  fmt_helper::append_string_view(this_00,view,(memory_buf_t *)dest_00);
  return;
}

Assistant:

void format(const details::log_msg &, const std::tm &tm_time, memory_buf_t &dest) override
    {
        string_view_t field_value{full_days[static_cast<size_t>(tm_time.tm_wday)]};
        ScopedPadder p(field_value.size(), padinfo_, dest);
        fmt_helper::append_string_view(field_value, dest);
    }